

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManSCHashTablesInit(Fxch_Man_t *pFxchMan)

{
  uint uVar1;
  long lVar2;
  Fxch_SCHashTable_t *pFVar3;
  long lVar4;
  int nEntries;
  uint uVar5;
  
  lVar2 = (long)pFxchMan->vCubes->nSize;
  if (lVar2 < 1) {
    nEntries = 0;
  }
  else {
    lVar4 = 0;
    nEntries = 0;
    do {
      uVar1 = *(uint *)((long)&pFxchMan->vCubes->pArray->nSize + lVar4);
      uVar5 = (uVar1 - 1) * uVar1 >> 1;
      if ((int)uVar1 < 4) {
        uVar5 = uVar1;
      }
      nEntries = nEntries + uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar2 * 0x10 != lVar4);
  }
  pFVar3 = Fxch_SCHashTableCreate(pFxchMan,nEntries);
  pFxchMan->pSCHashTable = pFVar3;
  return;
}

Assistant:

void Fxch_ManSCHashTablesInit( Fxch_Man_t* pFxchMan )
{
    Vec_Wec_t* vCubes = pFxchMan->vCubes;
    Vec_Int_t* vCube;
    int iCube,
        nTotalHashed = 0;

    Vec_WecForEachLevel( vCubes, vCube, iCube )
    {
        int nLits = Vec_IntSize( vCube ) - 1,
            nSubCubes = nLits <= 2? nLits + 1: ( nLits * nLits + nLits ) / 2;

        nTotalHashed += nSubCubes + 1;
    }

    pFxchMan->pSCHashTable = Fxch_SCHashTableCreate( pFxchMan, nTotalHashed );
}